

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O0

void __thiscall foxxll::linuxaio_queue::wait_requests(linuxaio_queue *this)

{
  uint uVar1;
  __pid_t _Var2;
  value_type vVar3;
  iterator pvVar4;
  long num_events_00;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  io_error *this_00;
  __sighandler_t __handler;
  aio_context_t aVar8;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream msg;
  long num_events;
  size_type sStack_28;
  int num_currently_posted_requests;
  undefined1 local_20 [8];
  simple_vector<io_event> events;
  linuxaio_queue *this_local;
  
  sStack_28 = (size_type)this->max_events_;
  events.array_ = (value_type *)this;
  tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::SimpleVector
            ((SimpleVector<io_event,_(tlx::SimpleVectorMode)0> *)local_20,&stack0xffffffffffffffd8);
  while( true ) {
    _Var2 = tlx::Semaphore::wait(&this->num_posted_requests_,(void *)0x1);
    vVar3 = shared_state<foxxll::request_queue_impl_worker::thread_state>::operator()
                      (&this->wait_thread_state_);
    if ((vVar3 == TERMINATING) && (_Var2 == 0)) break;
    while( true ) {
      aVar8 = this->context_;
      uVar1 = this->max_events_;
      pvVar4 = tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::data
                         ((SimpleVector<io_event,_(tlx::SimpleVectorMode)0> *)local_20);
      num_events_00 = syscall(0xd0,aVar8,1,(ulong)uVar1,pvVar4,0);
      if (-1 < num_events_00) break;
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        std::__cxx11::ostringstream::ostringstream(local_1c0);
        poVar6 = std::operator<<((ostream *)local_1c0,"Error in ");
        poVar6 = std::operator<<(poVar6,"void foxxll::linuxaio_queue::wait_requests()");
        poVar6 = std::operator<<(poVar6," : ");
        poVar6 = std::operator<<(poVar6,"linuxaio_queue::wait_requests io_getevents() nr_events=");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->max_events_);
        poVar6 = std::operator<<(poVar6," : ");
        piVar5 = __errno_location();
        pcVar7 = strerror(*piVar5);
        std::operator<<(poVar6,pcVar7);
        this_00 = (io_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::ostringstream::str();
        io_error::io_error(this_00,&local_1e0);
        __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
      }
    }
    tlx::Semaphore::signal(&this->num_posted_requests_,(int)aVar8,__handler);
    pvVar4 = tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::data
                       ((SimpleVector<io_event,_(tlx::SimpleVectorMode)0> *)local_20);
    handle_events(this,pvVar4,num_events_00,false);
  }
  tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::~SimpleVector
            ((SimpleVector<io_event,_(tlx::SimpleVectorMode)0> *)local_20);
  return;
}

Assistant:

void linuxaio_queue::wait_requests()
{
    tlx::simple_vector<io_event> events(max_events_);

    for ( ; ; ) // as long as thread is running
    {
        // might block until next request is posted or message comes in
        int num_currently_posted_requests = num_posted_requests_.wait();

        // terminate if termination has been requested
        if (wait_thread_state_() == TERMINATING &&
            num_currently_posted_requests == 0)
            break;

        // wait for at least one of them to finish
        long num_events;
        while (1) {
            num_events = syscall(
                    SYS_io_getevents, context_, 1,
                    max_events_, events.data(), nullptr
                );

            if (num_events < 0) {
                if (errno == EINTR) {
                    // io_getevents may return prematurely in case a signal is
                    // received
                    continue;
                }

                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_queue::wait_requests"
                    " io_getevents() nr_events=" << max_events_
                );
            }
            break;
        }

        // compensate for the one eaten prematurely above
        num_posted_requests_.signal();

        handle_events(events.data(), num_events, false);
    }
}